

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::TrackObjTypeSpecProperties(BackwardPass *this,PropertySymOpnd *opnd,BasicBlock *block)

{
  DictionaryStats *this_00;
  code *pcVar1;
  BasicBlock *pBVar2;
  bool bVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint16 uVar6;
  uint16 uVar7;
  PropertyId PVar8;
  PropertyId PVar9;
  uint functionId;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  JitArenaAllocator *pJVar13;
  BVSparse<Memory::JitArenaAllocator> *pBVar14;
  ObjTypeSpecFldInfo *this_01;
  JITManager *this_02;
  EquivalentTypeSet *leftTypeSet;
  EquivalentTypeSet *rightTypeSet;
  JITTimeFunctionBody *this_03;
  char16 *pcVar15;
  char16 *pcVar16;
  ThreadContext *this_04;
  PropertyRecord *this_05;
  char16 *pcVar17;
  RejitException *this_06;
  ObjTypeGuardBucket *this_07;
  StackSym *pSVar18;
  StackSym *auxSlotPtrSym;
  bool auxSlotPtrUpwardExposed;
  ObjTypeGuardBucket *objTypeGuardBucket;
  Type local_110;
  Type local_108;
  JITTypeHolder local_100;
  JITTypeHolder monoGuardType;
  char16 debugStringBuffer [42];
  ObjTypeSpecFldInfo *existingFldInfo;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex propOpId;
  TrackAllocData local_68;
  BVSparse<Memory::JitArenaAllocator> *local_40;
  BVSparse<Memory::JitArenaAllocator> *guardedPropertyOps;
  ObjTypeGuardBucket *bucket;
  StackSym *objSym;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *stackSymToGuardedProperties;
  BasicBlock *block_local;
  PropertySymOpnd *opnd_local;
  BackwardPass *this_local;
  
  stackSymToGuardedProperties = (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)block;
  block_local = (BasicBlock *)opnd;
  opnd_local = (PropertySymOpnd *)this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)block_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x159b,"(opnd->IsTypeCheckSeqCandidate())","opnd->IsTypeCheckSeqCandidate()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant((PropertySymOpnd *)block_local);
  if (bVar3) {
    objSym = (StackSym *)stackSymToGuardedProperties[3].stats;
    if (objSym == (StackSym *)0x0) {
      objSym = (StackSym *)
               HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::New
                         (&this->tempAlloc->super_ArenaAllocator,8);
      stackSymToGuardedProperties[3].stats = (DictionaryStats *)objSym;
    }
    bucket = (ObjTypeGuardBucket *)IR::PropertySymOpnd::GetObjectSym((PropertySymOpnd *)block_local)
    ;
    guardedPropertyOps =
         (BVSparse<Memory::JitArenaAllocator> *)
         HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::FindOrInsertNew
                   ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)objSym,
                    (((StackSym *)bucket)->super_Sym).m_id);
    local_40 = ObjTypeGuardBucket::GetGuardedPropertyOps((ObjTypeGuardBucket *)guardedPropertyOps);
    if (local_40 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar13 = this->tempAlloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_68,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                 ,0x15b0);
      pJVar13 = (JitArenaAllocator *)
                Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pJVar13,&local_68);
      pBVar14 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar13,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar14,this->tempAlloc);
      local_40 = pBVar14;
      ObjTypeGuardBucket::SetGuardedPropertyOps((ObjTypeGuardBucket *)guardedPropertyOps,pBVar14);
    }
    for (__startIndex = local_40->head; __startIndex != (Type_conflict)0x0;
        __startIndex = __startIndex->next) {
      _unit.word._0_4_ = __startIndex->startIndex;
      existingFldInfo = (ObjTypeSpecFldInfo *)(__startIndex->data).word;
      _unit.word._4_4_ =
           BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&existingFldInfo);
      while (_unit.word._4_4_ != 0xffffffff) {
        uVar11 = (Type)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&existingFldInfo,_unit.word._4_4_);
        this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->func,uVar11);
        if (this_01 == (ObjTypeSpecFldInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x15b8,"(existingFldInfo != nullptr)","existingFldInfo != nullptr");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        PVar8 = ObjTypeSpecFldInfo::GetPropertyId(this_01);
        PVar9 = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)block_local);
        if (PVar8 == PVar9) {
          uVar11 = Func::GetSourceContextId(this->func);
          functionId = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar11,functionId);
          if (bVar3) {
            this_02 = JITManager::GetJITManager();
            bVar3 = JITManager::IsJITServer(this_02);
            if (((!bVar3) && (bVar3 = ObjTypeSpecFldInfo::IsPoly(this_01), bVar3)) &&
               (bVar3 = IR::PropertySymOpnd::IsPoly((PropertySymOpnd *)block_local), bVar3)) {
              leftTypeSet = ObjTypeSpecFldInfo::GetEquivalentTypeSet(this_01);
              rightTypeSet = IR::PropertySymOpnd::GetEquivalentTypeSet
                                       ((PropertySymOpnd *)block_local);
              bVar3 = GlobOpt::AreTypeSetsIdentical(leftTypeSet,rightTypeSet);
              if (bVar3) {
                uVar6 = ObjTypeSpecFldInfo::GetSlotIndex(this_01);
                uVar7 = IR::PropertySymOpnd::GetSlotIndex((PropertySymOpnd *)block_local);
                if (uVar6 == uVar7) goto LAB_004e1925;
              }
              this_03 = Func::GetJITFunctionBody(this->func);
              pcVar15 = JITTimeFunctionBody::GetDisplayName(this_03);
              pcVar16 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&monoGuardType);
              this_04 = Func::GetInProcThreadContext(this->func);
              PVar8 = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)block_local);
              this_05 = ThreadContext::GetPropertyRecord(this_04,PVar8);
              pcVar17 = Js::PropertyRecord::GetBuffer(this_05);
              uVar10 = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)block_local);
              uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId((PropertySymOpnd *)block_local);
              Output::Print(L"EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"
                            ,pcVar15,pcVar16,pcVar17,(ulong)uVar10,(ulong)uVar11);
              Output::Flush();
            }
          }
        }
LAB_004e1925:
        _unit.word._4_4_ =
             BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&existingFldInfo);
      }
      if (__startIndex == (Type_conflict)0x0) break;
    }
    pBVar14 = guardedPropertyOps;
    uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId((PropertySymOpnd *)block_local);
    ObjTypeGuardBucket::AddToGuardedPropertyOps((ObjTypeGuardBucket *)pBVar14,uVar11);
    bVar3 = IR::PropertySymOpnd::NeedsMonoCheck((PropertySymOpnd *)block_local);
    if (bVar3) {
      bVar3 = IR::PropertySymOpnd::IsMono((PropertySymOpnd *)block_local);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x15df,"(opnd->IsMono())","opnd->IsMono()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar3 = IR::PropertySymOpnd::IsInitialTypeChecked((PropertySymOpnd *)block_local);
      if (bVar3) {
        local_100 = IR::PropertySymOpnd::GetInitialType((PropertySymOpnd *)block_local);
      }
      else {
        local_100 = IR::PropertySymOpnd::GetType((PropertySymOpnd *)block_local);
      }
      local_108 = local_100.t;
      ObjTypeGuardBucket::SetMonoGuardType((ObjTypeGuardBucket *)guardedPropertyOps,local_100);
    }
    bVar3 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck((PropertySymOpnd *)block_local);
    if (bVar3) {
      if (local_40 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x15f1,"(guardedPropertyOps != nullptr)","guardedPropertyOps != nullptr"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      IR::PropertySymOpnd::EnsureGuardedPropOps((PropertySymOpnd *)block_local,this->func->m_alloc);
      IR::PropertySymOpnd::AddGuardedPropOps((PropertySymOpnd *)block_local,local_40);
      bVar3 = IR::Instr::HasTypeCheckBailOut(this->currentInstr);
      if (bVar3) {
        bVar3 = ObjTypeGuardBucket::NeedsMonoCheck((ObjTypeGuardBucket *)guardedPropertyOps);
        if (bVar3) {
          bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(this->currentInstr);
          pBVar2 = block_local;
          if (bVar3) {
            local_110 = (Type)ObjTypeGuardBucket::GetMonoGuardType
                                        ((ObjTypeGuardBucket *)guardedPropertyOps);
            bVar3 = IR::PropertySymOpnd::SetMonoGuardType
                              ((PropertySymOpnd *)pBVar2,(JITTypeHolder)local_110);
            if (((bVar3 ^ 0xffU) & 1) != 0) {
              Func::ClearObjTypeSpecFldInfo
                        (this->currentInstr->m_func,*(uint *)&block_local->liveFixedFields);
              this_06 = (RejitException *)__cxa_allocate_exception(1);
              Js::RejitException::RejitException(this_06,FailedEquivalentTypeCheck);
              __cxa_throw(this_06,&Js::RejitException::typeinfo,0);
            }
            IR::Instr::ChangeEquivalentToMonoTypeCheckBailOut(this->currentInstr);
          }
          pBVar14 = guardedPropertyOps;
          JITTypeHolderBase<void>::JITTypeHolderBase
                    ((JITTypeHolderBase<void> *)&objTypeGuardBucket,(JITType *)0x0);
          ObjTypeGuardBucket::SetMonoGuardType
                    ((ObjTypeGuardBucket *)pBVar14,(JITTypeHolder)objTypeGuardBucket);
          ClearTypeIDWithFinalType
                    (this,*(int *)&bucket[1].guardedPropertyOps,
                     (BasicBlock *)stackSymToGuardedProperties);
        }
        bVar3 = IR::PropertySymOpnd::IsTypeAvailable((PropertySymOpnd *)block_local);
        if (!bVar3) {
          ObjTypeGuardBucket::SetGuardedPropertyOps
                    ((ObjTypeGuardBucket *)guardedPropertyOps,
                     (BVSparse<Memory::JitArenaAllocator> *)0x0);
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->tempAlloc,local_40);
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                    ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)
                     stackSymToGuardedProperties[3].stats,*(int *)&bucket[1].guardedPropertyOps);
        }
      }
      this_00 = stackSymToGuardedProperties[3].stats;
      pSVar18 = IR::PropertySymOpnd::GetObjectSym((PropertySymOpnd *)block_local);
      this_07 = HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Get
                          ((HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)this_00,
                           (pSVar18->super_Sym).m_id);
      bVar3 = IR::PropertySymOpnd::IsTypeAvailable((PropertySymOpnd *)block_local);
      if ((!bVar3) && (this_07 != (ObjTypeGuardBucket *)0x0)) {
        pBVar14 = ObjTypeGuardBucket::GetGuardedPropertyOps(this_07);
        bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar14);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1619,
                             "(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty())"
                             ,
                             "opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty()"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
      }
    }
  }
  else {
    bVar3 = IR::PropertySymOpnd::NeedsLocalTypeCheck((PropertySymOpnd *)block_local);
    if (bVar3) {
      IR::PropertySymOpnd::EnsureGuardedPropOps((PropertySymOpnd *)block_local,this->func->m_alloc);
      pBVar2 = block_local;
      uVar11 = IR::PropertySymOpnd::GetObjTypeSpecFldId((PropertySymOpnd *)block_local);
      IR::PropertySymOpnd::SetGuardedPropOp((PropertySymOpnd *)pBVar2,uVar11);
    }
  }
  bVar3 = IR::PropertySymOpnd::UsesAuxSlot((PropertySymOpnd *)block_local);
  if (((bVar3) &&
      (bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant((PropertySymOpnd *)block_local), bVar3
      )) && ((bVar3 = IR::PropertySymOpnd::HasTypeMismatch((PropertySymOpnd *)block_local), !bVar3
             && (bVar3 = IR::PropertySymOpnd::IsLoadedFromProto((PropertySymOpnd *)block_local),
                !bVar3)))) {
    bVar3 = false;
    pSVar18 = IR::PropertySymOpnd::GetAuxSlotPtrSym((PropertySymOpnd *)block_local);
    bVar4 = IR::PropertySymOpnd::IsAuxSlotPtrSymAvailable((PropertySymOpnd *)block_local);
    if (bVar4) {
      if (pSVar18 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x162b,"(auxSlotPtrSym)","auxSlotPtrSym");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        (this->currentBlock->upwardExposedUses,(pSVar18->super_Sym).m_id);
      bVar3 = BVar5 != '\0';
    }
    else if (pSVar18 != (StackSym *)0x0) {
      BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                        (this->currentBlock->upwardExposedUses,(pSVar18->super_Sym).m_id);
      bVar3 = BVar5 != '\0';
    }
    bVar4 = IsPrePass(this);
    if ((!bVar4) && (bVar3)) {
      IR::PropertySymOpnd::SetProducesAuxSlotPtr((PropertySymOpnd *)block_local,true);
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackObjTypeSpecProperties(IR::PropertySymOpnd *opnd, BasicBlock *block)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(opnd->IsTypeCheckSeqCandidate());

    // Now that we're in the dead store pass and we know definitively which operations will have a type
    // check and which are protected by an upstream type check, we can push the lists of guarded properties
    // up the flow graph and drop them on the type checks for the corresponding object symbol.
    if (opnd->IsTypeCheckSeqParticipant())
    {
        // Add this operation to the list of guarded operations for this object symbol.
        HashTable<ObjTypeGuardBucket>* stackSymToGuardedProperties = block->stackSymToGuardedProperties;
        if (stackSymToGuardedProperties == nullptr)
        {
            stackSymToGuardedProperties = HashTable<ObjTypeGuardBucket>::New(this->tempAlloc, 8);
            block->stackSymToGuardedProperties = stackSymToGuardedProperties;
        }

        StackSym* objSym = opnd->GetObjectSym();
        ObjTypeGuardBucket* bucket = stackSymToGuardedProperties->FindOrInsertNew(objSym->m_id);
        BVSparse<JitArenaAllocator>* guardedPropertyOps = bucket->GetGuardedPropertyOps();
        if (guardedPropertyOps == nullptr)
        {
            // The bit vectors we push around the flow graph only need to live as long as this phase.
            guardedPropertyOps = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
            bucket->SetGuardedPropertyOps(guardedPropertyOps);
        }

#if DBG
        FOREACH_BITSET_IN_SPARSEBV(propOpId, guardedPropertyOps)
        {
            ObjTypeSpecFldInfo* existingFldInfo = this->func->GetGlobalObjTypeSpecFldInfo(propOpId);
            Assert(existingFldInfo != nullptr);

            if (existingFldInfo->GetPropertyId() != opnd->GetPropertyId())
            {
                continue;
            }
            // It would be very nice to assert that the info we have for this property matches all properties guarded thus far.
            // Unfortunately, in some cases of object pointer copy propagation into a loop, we may end up with conflicting
            // information for the same property. We simply ignore the conflict and emit an equivalent type check, which
            // will attempt to check for one property on two different slots, and obviously fail. Thus we may have a
            // guaranteed bailout, but we'll simply re-JIT with equivalent object type spec disabled. To avoid this
            // issue altogether, we would need to track the set of guarded properties along with the type value in the
            // forward pass, and when a conflict is detected either not optimize the offending instruction, or correct
            // its information based on the info from the property in the type value info.
            //Assert(!existingFldInfo->IsPoly() || !opnd->IsPoly() || GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()));
            //Assert(existingFldInfo->GetSlotIndex() == opnd->GetSlotIndex());

            if (PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->func) && !JITManager::GetJITManager()->IsJITServer())
            {
                if (existingFldInfo->IsPoly() && opnd->IsPoly() &&
                    (!GlobOpt::AreTypeSetsIdentical(existingFldInfo->GetEquivalentTypeSet(), opnd->GetEquivalentTypeSet()) ||
                    (existingFldInfo->GetSlotIndex() != opnd->GetSlotIndex())))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("EquivObjTypeSpec: top function %s (%s): duplicate property clash on %s(#%d) on operation %u \n"),
                        this->func->GetJITFunctionBody()->GetDisplayName(), this->func->GetDebugNumberSet(debugStringBuffer),
                        this->func->GetInProcThreadContext()->GetPropertyRecord(opnd->GetPropertyId())->GetBuffer(), opnd->GetPropertyId(), opnd->GetObjTypeSpecFldId());
                    Output::Flush();
                }
            }
        }
        NEXT_BITSET_IN_SPARSEBV
#endif

        bucket->AddToGuardedPropertyOps(opnd->GetObjTypeSpecFldId());

        if (opnd->NeedsMonoCheck())
        {
            Assert(opnd->IsMono());
            JITTypeHolder monoGuardType = opnd->IsInitialTypeChecked() ? opnd->GetInitialType() : opnd->GetType();
            bucket->SetMonoGuardType(monoGuardType);
        }

        if (opnd->NeedsPrimaryTypeCheck())
        {
            // Grab the guarded properties which match this type check with respect to polymorphism and drop them
            // on the operand. Only equivalent type checks can protect polymorphic properties to avoid a case where
            // we have 1) a cache with type set {t1, t2} and property a, followed by 2) a cache with type t3 and
            // property b, and 3) a cache with type set {t1, t2} and property c, where the slot index of property c
            // on t1 and t2 is different than on t3. If cache 2 were to protect property c it would not verify that
            // it resides on the correct slot for cache 3.  Yes, an equivalent type check could protect monomorphic
            // properties, but it would then unnecessarily verify their equivalence on the slow path.

            // Also, make sure the guarded properties on the operand are allocated from the func's allocator to
            // persists until lowering.

            Assert(guardedPropertyOps != nullptr);
            opnd->EnsureGuardedPropOps(this->func->m_alloc);
            opnd->AddGuardedPropOps(guardedPropertyOps);
            if (this->currentInstr->HasTypeCheckBailOut())
            {
                // Stop pushing the mono guard type up if it is being checked here.
                if (bucket->NeedsMonoCheck())
                {
                    if (this->currentInstr->HasEquivalentTypeCheckBailOut())
                    {
                        // Some instr protected by this one requires a monomorphic type check. (E.g., final type opt,
                        // fixed field not loaded from prototype.) Note the IsTypeAvailable test above: only do this at
                        // the initial type check that protects this path.
                        if (!opnd->SetMonoGuardType(bucket->GetMonoGuardType()))
                        {
                            // We can't safely check for the required type here. Clear the objtypespec info to disable optimization
                            // using this inline cache, since there appears to be a mismatch, and re-jit.
                            // (Dead store pass is too late to generate the bailout points we need to use this type correctly.)
                            this->currentInstr->m_func->ClearObjTypeSpecFldInfo(opnd->m_inlineCacheIndex);
                            throw Js::RejitException(RejitReason::FailedEquivalentTypeCheck);
                        }
                        this->currentInstr->ChangeEquivalentToMonoTypeCheckBailOut();
                    }
                    bucket->SetMonoGuardType(nullptr);
                    this->ClearTypeIDWithFinalType(objSym->m_id, block);
                }

                if (!opnd->IsTypeAvailable())
                {
                    // Stop tracking the guarded properties if there's not another type check upstream.
                    bucket->SetGuardedPropertyOps(nullptr);
                    JitAdelete(this->tempAlloc, guardedPropertyOps);
                    block->stackSymToGuardedProperties->Clear(objSym->m_id);
                }
            }
#if DBG
            {
                // If there is no upstream type check that is live and could protect guarded properties, we better
                // not have any properties remaining.
                ObjTypeGuardBucket* objTypeGuardBucket = block->stackSymToGuardedProperties->Get(opnd->GetObjectSym()->m_id);
                Assert(opnd->IsTypeAvailable() || objTypeGuardBucket == nullptr || objTypeGuardBucket->GetGuardedPropertyOps()->IsEmpty());
            }
#endif
        }
    }
    else if (opnd->NeedsLocalTypeCheck())
    {
        opnd->EnsureGuardedPropOps(this->func->m_alloc);
        opnd->SetGuardedPropOp(opnd->GetObjTypeSpecFldId());
    }

    if (opnd->UsesAuxSlot() && opnd->IsTypeCheckSeqParticipant() && !opnd->HasTypeMismatch() && !opnd->IsLoadedFromProto())
    {
        bool auxSlotPtrUpwardExposed = false;
        StackSym *auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
        if (opnd->IsAuxSlotPtrSymAvailable())
        {    
            // This is an upward-exposed use of the aux slot pointer.
            Assert(auxSlotPtrSym);
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndSet(auxSlotPtrSym->m_id);
        }
        else if (auxSlotPtrSym != nullptr)
        {
            // The aux slot pointer is not upward-exposed at this point.
            auxSlotPtrUpwardExposed = this->currentBlock->upwardExposedUses->TestAndClear(auxSlotPtrSym->m_id);
        }
        if (!this->IsPrePass() && auxSlotPtrUpwardExposed)
        {
            opnd->SetProducesAuxSlotPtr(true);
        }
    }
}